

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

void Assimp::IFC::ConvertCartesianPoint(IfcVector3 *out,IfcCartesianPoint *in)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  double *pdVar4;
  ulong local_38;
  size_t i;
  double local_28;
  double local_20;
  IfcCartesianPoint *local_18;
  IfcCartesianPoint *in_local;
  IfcVector3 *out_local;
  
  local_18 = in;
  in_local = (IfcCartesianPoint *)out;
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&i);
  (in_local->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)i;
  *(double *)
   &(in_local->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x8 = local_28;
  *(double *)
   &(in_local->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = local_20;
  local_38 = 0;
  while( true ) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)
                       &(local_18->super_IfcPoint).field_0x40);
    if (sVar2 <= local_38) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &(local_18->super_IfcPoint).field_0x40,local_38);
    vVar1 = *pvVar3;
    pdVar4 = aiVector3t<double>::operator[]((aiVector3t<double> *)in_local,(uint)local_38);
    *pdVar4 = vVar1;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void ConvertCartesianPoint(IfcVector3& out, const Schema_2x3::IfcCartesianPoint& in)
{
    out = IfcVector3();
    for(size_t i = 0; i < in.Coordinates.size(); ++i) {
        out[static_cast<unsigned int>(i)] = in.Coordinates[i];
    }
}